

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O3

void __thiscall script_tests::script_assets_test::test_method(script_assets_test *this)

{
  char *pcVar1;
  pointer pcVar2;
  string strFlags;
  undefined8 uVar3;
  pointer pCVar4;
  pointer pCVar5;
  char cVar6;
  readonly_property<bool> rVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  _func_int **pp_Var11;
  size_type __n;
  UniValue *pUVar12;
  string *psVar13;
  UniValue *pUVar14;
  UniValue *pUVar15;
  long lVar16;
  uint *puVar17;
  size_t index;
  iterator in_R8;
  iterator pvVar18;
  BaseSignatureChecker *pBVar19;
  iterator in_R9;
  iterator pvVar20;
  uint *puVar21;
  size_t index_00;
  long in_FS_OFFSET;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  string_view jsondata;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  string_view hex_str;
  string_view hex_str_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  uint64_t obj;
  vector<CTxOut,_std::allocator<CTxOut>_> prevouts;
  CMutableTransaction mtx;
  UniValue tests;
  string data;
  ifstream file;
  path path;
  SignatureCache signature_cache;
  CachingTransactionSignatureChecker txcheck;
  PrecomputedTransactionData txdata;
  size_t i;
  undefined4 uVar22;
  undefined4 uVar23;
  check_type cVar24;
  vector<CTxOut,_std::allocator<CTxOut>_> *this_00;
  long in_stack_fffffffffffff710;
  char *local_8c8;
  char *local_8c0;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  undefined1 local_788 [8];
  pointer pvStack_780;
  pointer local_778;
  char **local_770;
  assertion_result local_760;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  vector<CTxOut,_std::allocator<CTxOut>_> local_6f8;
  CMutableTransaction local_6d8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  UniValue local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  lazy_ostream local_5f8;
  undefined1 *local_5e8;
  char *local_5e0;
  path local_3f0;
  path local_3c8;
  SignatureCache local_3a0;
  undefined1 local_238 [16];
  undefined1 local_228 [24];
  undefined1 local_210;
  SignatureCache *local_208;
  undefined1 local_200 [8];
  undefined1 auStack_1f8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1f0;
  uint local_1dc;
  vector<CTxOut,_std::allocator<CTxOut>_> local_f8;
  undefined1 local_d8 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> local_c0 [4];
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  SignatureCache::SignatureCache(&local_3a0,0x1000000);
  pp_Var11 = (_func_int **)getenv("DIR_UNIT_TEST_DATA");
  local_7e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_7e0 = "";
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x646;
  file_00.m_begin = (iterator)&local_7e8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_7f8,msg);
  local_200[0] = pp_Var11 != (_func_int **)0x0;
  auStack_1f8._0_4_ = 0;
  auStack_1f8._4_4_ = 0;
  aStack_1f0._M_allocated_capacity._0_2_ = 0;
  aStack_1f0._M_local_buf[2] = '\0';
  aStack_1f0._M_local_buf[3] = '\0';
  aStack_1f0._M_local_buf[4] = '\0';
  aStack_1f0._M_local_buf[5] = '\0';
  aStack_1f0._M_local_buf[6] = '\0';
  aStack_1f0._M_local_buf[7] = '\0';
  local_5f8.m_empty = false;
  local_5f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013af250;
  local_5e8 = boost::unit_test::lazy_ostream::inst;
  local_5e0 = "Variable DIR_UNIT_TEST_DATA unset, skipping script_assets_test";
  local_808 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_800 = "";
  pvVar18 = (iterator)0x0;
  pvVar20 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_200,&local_5f8,0,1,WARN,_cVar24,(size_t)&local_808,0x646);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1f8 + 8));
  if (pp_Var11 != (_func_int **)0x0) {
    local_5f8._vptr_lazy_ostream = pp_Var11;
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_3f0,(char **)&local_5f8,auto_format);
    std::filesystem::__cxx11::path::_M_append(&local_3f0,0x17,"script_assets_test.json");
    std::filesystem::__cxx11::path::path(&local_3c8,&local_3f0);
    std::filesystem::__cxx11::path::~path(&local_3f0);
    cVar6 = std::filesystem::status((path *)&local_3c8);
    local_818 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_810 = "";
    local_828 = &boost::unit_test::basic_cstring<char_const>::null;
    local_820 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x64a;
    file_01.m_begin = (iterator)&local_818;
    msg_00.m_end = pvVar20;
    msg_00.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_828,
               msg_00);
    local_200[0] = cVar6 != -1 && cVar6 != '\0';
    auStack_1f8._0_4_ = 0;
    auStack_1f8._4_4_ = 0;
    aStack_1f0._M_allocated_capacity._0_2_ = 0;
    aStack_1f0._M_local_buf[2] = '\0';
    aStack_1f0._M_local_buf[3] = '\0';
    aStack_1f0._M_local_buf[4] = '\0';
    aStack_1f0._M_local_buf[5] = '\0';
    aStack_1f0._M_local_buf[6] = '\0';
    aStack_1f0._M_local_buf[7] = '\0';
    local_5f8.m_empty = false;
    local_5f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013b25e0;
    local_5e8 = boost::unit_test::lazy_ostream::inst;
    local_5e0 = 
    "File $DIR_UNIT_TEST_DATA/script_assets_test.json not found, skipping script_assets_test";
    local_838 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_830 = "";
    pvVar18 = (iterator)0x0;
    pvVar20 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_200,&local_5f8,0,1,WARN,_cVar24,(size_t)&local_838,0x64a);
    boost::detail::shared_count::~shared_count((shared_count *)(auStack_1f8 + 8));
    aStack_1f0._8_8_ = (CMutableTransaction *)CONCAT44(aStack_1f0._12_4_,aStack_1f0._8_4_);
    if ((cVar6 != '\0') &&
       (aStack_1f0._8_8_ = (CMutableTransaction *)CONCAT44(aStack_1f0._12_4_,aStack_1f0._8_4_),
       cVar6 != -1)) {
      std::ifstream::ifstream(&local_5f8,local_3c8._M_pathname._M_dataplus._M_p,_S_in);
      local_848 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_840 = "";
      local_858 = &boost::unit_test::basic_cstring<char_const>::null;
      local_850 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x64d;
      file_02.m_begin = (iterator)&local_848;
      msg_01.m_end = pvVar20;
      msg_01.m_begin = pvVar18;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_858,
                 msg_01);
      rVar7.super_class_property<bool>.value =
           (class_property<bool>)std::__basic_file<char>::is_open();
      local_d8._8_8_ = (element_type *)0x0;
      local_d8._16_8_ = (sp_counted_base *)0x0;
      aStack_1f0._8_8_ = &local_670;
      local_670._0_8_ = "file.is_open()";
      local_670.val._M_dataplus._M_p = "";
      auStack_1f8._0_4_ = auStack_1f8._0_4_ & 0xffffff00;
      local_200 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
      aStack_1f0._M_allocated_capacity._0_2_ = 0x2138;
      aStack_1f0._M_local_buf[2] = '<';
      aStack_1f0._M_local_buf[3] = '\x01';
      aStack_1f0._M_local_buf[4] = '\0';
      aStack_1f0._M_local_buf[5] = '\0';
      aStack_1f0._M_local_buf[6] = '\0';
      aStack_1f0._M_local_buf[7] = '\0';
      local_868 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_860 = "";
      pvVar18 = (iterator)0x1;
      pvVar20 = (iterator)0x0;
      local_d8[0] = rVar7.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_d8,(lazy_ostream *)local_200,1,0,WARN,_cVar24,
                 (size_t)&local_868,0x64d);
      boost::detail::shared_count::~shared_count((shared_count *)(local_d8 + 0x10));
      std::istream::seekg((long)&local_5f8,_S_beg);
      __n = std::istream::tellg();
      std::istream::seekg((long)&local_5f8,_S_beg);
      local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_618,__n,'\0');
      std::istream::read((char *)&local_5f8,(long)local_618._M_dataplus._M_p);
      jsondata._M_str = local_618._M_dataplus._M_p;
      jsondata._M_len = local_618._M_string_length;
      read_json(&local_670,jsondata);
      local_878 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_870 = "";
      local_888 = &boost::unit_test::basic_cstring<char_const>::null;
      local_880 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x654;
      file_03.m_begin = (iterator)&local_878;
      msg_02.m_end = pvVar20;
      msg_02.m_begin = pvVar18;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_888,
                 msg_02);
      local_d8[0] = (class_property<bool>)(local_670.typ == VARR);
      local_d8._8_8_ = (element_type *)0x0;
      local_d8._16_8_ = (sp_counted_base *)0x0;
      aStack_1f0._8_8_ = &local_6d8;
      local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xed8d43;
      local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xed8d52;
      auStack_1f8._0_4_ = auStack_1f8._0_4_ & 0xffffff00;
      local_200 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
      aStack_1f0._M_allocated_capacity._0_2_ = 0x2138;
      aStack_1f0._M_local_buf[2] = '<';
      aStack_1f0._M_local_buf[3] = '\x01';
      aStack_1f0._M_local_buf[4] = '\0';
      aStack_1f0._M_local_buf[5] = '\0';
      aStack_1f0._M_local_buf[6] = '\0';
      aStack_1f0._M_local_buf[7] = '\0';
      local_898 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_890 = "";
      pvVar18 = (iterator)0x1;
      pvVar20 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_d8,(lazy_ostream *)local_200,1,0,WARN,_cVar24,
                 (size_t)&local_898,0x654);
      boost::detail::shared_count::~shared_count((shared_count *)(local_d8 + 0x10));
      local_8a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_8a0 = "";
      local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x655;
      file_04.m_begin = (iterator)&local_8a8;
      msg_03.m_end = pvVar20;
      msg_03.m_begin = pvVar18;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_8b8,
                 msg_03);
      local_d8[0] = (class_property<bool>)
                    (class_property<bool>)
                    (local_670.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                     _M_impl.super__Vector_impl_data._M_finish !=
                    local_670.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                    .super__Vector_impl_data._M_start);
      local_d8._8_8_ = (element_type *)0x0;
      local_d8._16_8_ = (sp_counted_base *)0x0;
      local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xed8d53;
      local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xed8d63;
      auStack_1f8._0_4_ = auStack_1f8._0_4_ & 0xffffff00;
      local_200 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
      aStack_1f0._M_allocated_capacity._0_2_ = 0x2138;
      aStack_1f0._M_local_buf[2] = '<';
      aStack_1f0._M_local_buf[3] = '\x01';
      aStack_1f0._M_local_buf[4] = '\0';
      aStack_1f0._M_local_buf[5] = '\0';
      aStack_1f0._M_local_buf[6] = '\0';
      aStack_1f0._M_local_buf[7] = '\0';
      aStack_1f0._8_8_ = &local_6d8;
      local_8c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_8c0 = "";
      pvVar18 = (iterator)0x1;
      pvVar20 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_d8,(lazy_ostream *)local_200,1,0,WARN,_cVar24,
                 (size_t)&local_8c8,0x655);
      boost::detail::shared_count::~shared_count((shared_count *)(local_d8 + 0x10));
      if (local_670.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_670.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start) {
        this_00 = &local_f8;
        index = 0;
        do {
          pUVar12 = ::UniValue::operator[](&local_670,index);
          local_680 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
          ;
          local_678 = "";
          local_690 = &boost::unit_test::basic_cstring<char_const>::null;
          local_688 = &boost::unit_test::basic_cstring<char_const>::null;
          file_05.m_end = (iterator)0x612;
          file_05.m_begin = (iterator)&local_680;
          msg_04.m_end = pvVar20;
          msg_04.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                     (size_t)&local_690,msg_04);
          local_d8[0] = (class_property<bool>)(class_property<bool>)(pUVar12->typ == VOBJ);
          local_d8._8_8_ = (element_type *)0x0;
          local_d8._16_8_ = (sp_counted_base *)0x0;
          local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0xed9755;
          local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0xed9764;
          auStack_1f8._0_4_ = auStack_1f8._0_4_ & 0xffffff00;
          local_200 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
          pp_Var11 = (_func_int **)(auStack_1f8 + 8);
          aStack_1f0._M_allocated_capacity._0_2_ = 0x2138;
          aStack_1f0._M_local_buf[2] = '<';
          aStack_1f0._M_local_buf[3] = '\x01';
          aStack_1f0._M_local_buf[4] = '\0';
          aStack_1f0._M_local_buf[5] = '\0';
          aStack_1f0._M_local_buf[6] = '\0';
          aStack_1f0._M_local_buf[7] = '\0';
          aStack_1f0._8_8_ = &local_6d8;
          local_6a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
          ;
          local_698 = "";
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x0;
          pUVar14 = pUVar12;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_d8,(lazy_ostream *)local_200,1,0,WARN,
                     (check_type)pUVar12,(size_t)&local_6a0,0x612);
          boost::detail::shared_count::~shared_count((shared_count *)(local_d8 + 0x10));
          aStack_1f0._M_allocated_capacity._0_2_ = 0x7874;
          auStack_1f8._0_4_ = 2;
          auStack_1f8._4_4_ = 0;
          aStack_1f0._M_local_buf[2] = '\0';
          local_200 = (undefined1  [8])pp_Var11;
          pUVar12 = ::UniValue::operator[](pUVar12,(string *)local_200);
          psVar13 = ::UniValue::get_str_abi_cxx11_(pUVar12);
          CMutableTransaction::CMutableTransaction(&local_6d8);
          hex_str._M_str = (psVar13->_M_dataplus)._M_p;
          hex_str._M_len = psVar13->_M_string_length;
          ParseHex<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,hex_str);
          pvStack_780 = (pointer)(local_d8._8_8_ - local_d8._0_8_);
          local_788 = (undefined1  [8])local_d8._0_8_;
          local_238._0_8_ = &::TX_NO_WITNESS;
          local_238._8_8_ = local_788;
          UnserializeTransaction<ParamsStream<SpanReader&,TransactionSerParams>,CMutableTransaction>
                    (&local_6d8,(ParamsStream<SpanReader_&,_TransactionSerParams> *)local_238,
                     &::TX_NO_WITNESS);
          pUVar12 = pUVar14;
          if ((pointer)local_d8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
          }
          if (local_200 != (undefined1  [8])pp_Var11) {
            operator_delete((void *)local_200,
                            CONCAT17(aStack_1f0._M_local_buf[7],
                                     CONCAT16(aStack_1f0._M_local_buf[6],
                                              CONCAT15(aStack_1f0._M_local_buf[5],
                                                       CONCAT14(aStack_1f0._M_local_buf[4],
                                                                CONCAT13(aStack_1f0._M_local_buf[3],
                                                                         CONCAT12(aStack_1f0.
                                                                                  _M_local_buf[2],
                                                                                  aStack_1f0.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_2_)))))) + 1);
          }
          local_d8._0_8_ = local_d8 + 0x10;
          local_d8._16_8_ = (sp_counted_base *)0x7374756f76657270;
          local_d8._8_8_ = &DAT_00000008;
          local_c0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = 0;
          pUVar14 = ::UniValue::operator[](pUVar14,(string *)local_d8);
          if (pUVar14->typ != VARR) {
            __assert_fail("univalue.isArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
                          ,0x5df,
                          "std::vector<CTxOut> script_tests::TxOutsFromJSON(const UniValue &)");
          }
          local_6f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_6f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_6f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((pUVar14->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (pUVar14->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start) {
            index_00 = 0;
            do {
              CTxOut::CTxOut((CTxOut *)local_200);
              pUVar15 = ::UniValue::operator[](pUVar14,index_00);
              psVar13 = ::UniValue::get_str_abi_cxx11_(pUVar15);
              hex_str_00._M_str = (psVar13->_M_dataplus)._M_p;
              hex_str_00._M_len = psVar13->_M_string_length;
              ParseHex<unsigned_char>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238,
                         hex_str_00);
              pvStack_780 = (pointer)(local_238._8_8_ - local_238._0_8_);
              local_788 = (undefined1  [8])local_238._0_8_;
              SpanReader::read((SpanReader *)local_788,(int)&local_760,&DAT_00000008,
                               (size_t)pvStack_780);
              local_200 = (undefined1  [8])
                          CONCAT71(local_760._1_7_,
                                   local_760.p_predicate_value.super_readonly_property<bool>.
                                   super_class_property<bool>.value);
              Unserialize<SpanReader,28u,unsigned_char>
                        ((SpanReader *)local_788,
                         (prevector<28U,_unsigned_char,_unsigned_int,_int> *)auStack_1f8);
              if ((pointer)local_238._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_238._0_8_,local_228._0_8_ - local_238._0_8_);
              }
              std::vector<CTxOut,_std::allocator<CTxOut>_>::emplace_back<CTxOut>
                        (&local_6f8,(CTxOut *)local_200);
              if (0x1c < local_1dc) {
                free((void *)CONCAT44(auStack_1f8._4_4_,auStack_1f8._0_4_));
              }
              index_00 = index_00 + 1;
            } while (index_00 <
                     (ulong)(((long)(pUVar14->values).
                                    super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)(pUVar14->values).
                                    super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3));
          }
          if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,(ulong)((long)(_func_int ***)local_d8._16_8_ + 1)
                           );
          }
          local_708 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
          ;
          local_700 = "";
          local_718 = &boost::unit_test::basic_cstring<char_const>::null;
          local_710 = &boost::unit_test::basic_cstring<char_const>::null;
          file_06.m_end = (iterator)0x616;
          file_06.m_begin = (iterator)&local_708;
          msg_05.m_end = pvVar20;
          msg_05.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                     (size_t)&local_718,msg_05);
          local_d8[0] = (class_property<bool>)
                        (class_property<bool>)
                        (((long)local_6f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_6f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333
                         + ((long)local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x4ec4ec4ec4ec4ec5 == 0);
          local_d8._8_8_ = (element_type *)0x0;
          local_d8._16_8_ = (sp_counted_base *)0x0;
          local_238._0_8_ = "prevouts.size() == mtx.vin.size()";
          local_238._8_8_ = "";
          auStack_1f8._0_4_ = auStack_1f8._0_4_ & 0xffffff00;
          local_200 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
          aStack_1f0._M_allocated_capacity._0_2_ = 0x2138;
          aStack_1f0._M_local_buf[2] = '<';
          aStack_1f0._M_local_buf[3] = '\x01';
          aStack_1f0._M_local_buf[4] = '\0';
          aStack_1f0._M_local_buf[5] = '\0';
          aStack_1f0._M_local_buf[6] = '\0';
          aStack_1f0._M_local_buf[7] = '\0';
          local_728 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
          ;
          local_720 = "";
          uVar22 = 0;
          uVar23 = 0;
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x0;
          aStack_1f0._8_8_ = (CMutableTransaction *)local_238;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_d8,(lazy_ostream *)local_200,1,0,WARN,
                     (check_type)pUVar12,(size_t)&local_728,0x616);
          boost::detail::shared_count::~shared_count((shared_count *)(local_d8 + 0x10));
          aStack_1f0._M_local_buf[4] = 'x';
          aStack_1f0._M_allocated_capacity._0_2_ = 0x6e69;
          aStack_1f0._M_local_buf[2] = 'd';
          aStack_1f0._M_local_buf[3] = 'e';
          auStack_1f8._0_4_ = 5;
          auStack_1f8._4_4_ = 0;
          aStack_1f0._M_local_buf[5] = '\0';
          local_200 = (undefined1  [8])pp_Var11;
          pUVar14 = ::UniValue::operator[](pUVar12,(string *)local_200);
          lVar16 = ::UniValue::getInt<long>(pUVar14);
          if (local_200 != (undefined1  [8])pp_Var11) {
            operator_delete((void *)local_200,
                            CONCAT17(aStack_1f0._M_local_buf[7],
                                     CONCAT16(aStack_1f0._M_local_buf[6],
                                              CONCAT15(aStack_1f0._M_local_buf[5],
                                                       CONCAT14(aStack_1f0._M_local_buf[4],
                                                                CONCAT13(aStack_1f0._M_local_buf[3],
                                                                         CONCAT12(aStack_1f0.
                                                                                  _M_local_buf[2],
                                                                                  aStack_1f0.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_2_)))))) + 1);
          }
          aStack_1f0._M_local_buf[4] = 's';
          aStack_1f0._M_allocated_capacity._0_2_ = 0x6c66;
          aStack_1f0._M_local_buf[2] = 'a';
          aStack_1f0._M_local_buf[3] = 'g';
          auStack_1f8._0_4_ = 5;
          auStack_1f8._4_4_ = 0;
          aStack_1f0._M_local_buf[5] = '\0';
          pUVar14 = pUVar12;
          local_200 = (undefined1  [8])pp_Var11;
          pUVar15 = ::UniValue::operator[](pUVar12,(string *)local_200);
          psVar13 = ::UniValue::get_str_abi_cxx11_(pUVar15);
          local_58[0] = local_48;
          pcVar2 = (psVar13->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,pcVar2,pcVar2 + psVar13->_M_string_length);
          strFlags._M_dataplus._M_p._4_4_ = uVar23;
          strFlags._M_dataplus._M_p._0_4_ = uVar22;
          strFlags._M_string_length = (size_type)pUVar14;
          strFlags.field_2._M_allocated_capacity = (size_type)this_00;
          strFlags.field_2._8_8_ = in_stack_fffffffffffff710;
          uVar10 = ParseScriptFlags(strFlags);
          if (local_58[0] != local_48) {
            operator_delete(local_58[0],local_48[0] + 1);
          }
          if (local_200 != (undefined1  [8])pp_Var11) {
            operator_delete((void *)local_200,
                            CONCAT17(aStack_1f0._M_local_buf[7],
                                     CONCAT16(aStack_1f0._M_local_buf[6],
                                              CONCAT15(aStack_1f0._M_local_buf[5],
                                                       CONCAT14(aStack_1f0._M_local_buf[4],
                                                                CONCAT13(aStack_1f0._M_local_buf[3],
                                                                         CONCAT12(aStack_1f0.
                                                                                  _M_local_buf[2],
                                                                                  aStack_1f0.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_2_)))))) + 1);
          }
          aStack_1f0._M_local_buf[4] = 'l';
          aStack_1f0._M_allocated_capacity._0_2_ = 0x6966;
          aStack_1f0._M_local_buf[2] = 'n';
          aStack_1f0._M_local_buf[3] = 'a';
          auStack_1f8._0_4_ = 5;
          auStack_1f8._4_4_ = 0;
          aStack_1f0._M_local_buf[5] = '\0';
          local_200 = (undefined1  [8])pp_Var11;
          bVar8 = ::UniValue::findKey(pUVar12,(string *)local_200,(size_t *)local_d8);
          if (bVar8) {
            local_d8._0_8_ = local_d8 + 0x10;
            local_d8._8_8_ = (element_type *)0x5;
            local_d8._16_6_ = 0x6c616e6966;
            pUVar15 = ::UniValue::operator[](pUVar12,(string *)local_d8);
            bVar8 = ::UniValue::get_bool(pUVar15);
            if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
              operator_delete((void *)local_d8._0_8_,
                              (ulong)((long)(_func_int ***)local_d8._16_8_ + 1));
            }
          }
          else {
            bVar8 = false;
          }
          if (local_200 != (undefined1  [8])pp_Var11) {
            operator_delete((void *)local_200,
                            CONCAT17(aStack_1f0._M_local_buf[7],
                                     CONCAT16(aStack_1f0._M_local_buf[6],
                                              CONCAT15(aStack_1f0._M_local_buf[5],
                                                       CONCAT14(aStack_1f0._M_local_buf[4],
                                                                CONCAT13(aStack_1f0._M_local_buf[3],
                                                                         CONCAT12(aStack_1f0.
                                                                                  _M_local_buf[2],
                                                                                  aStack_1f0.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_2_)))))) + 1);
          }
          aStack_1f0._M_local_buf[4] = 'e';
          aStack_1f0._M_local_buf[5] = 's';
          aStack_1f0._M_local_buf[6] = 's';
          aStack_1f0._M_allocated_capacity._0_2_ = 0x7573;
          aStack_1f0._M_local_buf[2] = 'c';
          aStack_1f0._M_local_buf[3] = 'c';
          auStack_1f8._0_4_ = 7;
          auStack_1f8._4_4_ = 0;
          aStack_1f0._M_local_buf[7] = '\0';
          local_200 = (undefined1  [8])pp_Var11;
          bVar9 = ::UniValue::findKey(pUVar12,(string *)local_200,(size_t *)local_d8);
          if (local_200 != (undefined1  [8])pp_Var11) {
            operator_delete((void *)local_200,
                            CONCAT17(aStack_1f0._M_local_buf[7],
                                     CONCAT16(aStack_1f0._M_local_buf[6],
                                              CONCAT15(aStack_1f0._M_local_buf[5],
                                                       CONCAT14(aStack_1f0._M_local_buf[4],
                                                                CONCAT13(aStack_1f0._M_local_buf[3],
                                                                         CONCAT12(aStack_1f0.
                                                                                  _M_local_buf[2],
                                                                                  aStack_1f0.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_2_)))))) + 1);
          }
          if (bVar9) {
            local_d8._0_8_ = local_d8 + 0x10;
            local_d8._16_8_ = (sp_counted_base *)0x73736563637573;
            local_d8._8_8_ = (element_type *)0x7;
            pUVar12 = ::UniValue::operator[](pUVar14,(string *)local_d8);
            local_228._0_8_ = (pointer)0x6953747069726373;
            local_238._8_8_ = (pointer)0x9;
            local_228._8_2_ = 0x67;
            local_238._0_8_ = (pointer)(local_238 + 0x10);
            pUVar12 = ::UniValue::operator[](pUVar12,(string *)local_238);
            psVar13 = ::UniValue::get_str_abi_cxx11_(pUVar12);
            ScriptFromHex((CScript *)local_200,(script_tests *)(psVar13->_M_dataplus)._M_p,
                          (string *)psVar13->_M_string_length);
            pCVar5 = local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start;
            in_stack_fffffffffffff710 = lVar16 * 0x68;
            pCVar4 = local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar16;
            uVar3 = aStack_1f0._8_8_;
            if (0x1c < local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar16].scriptSig.super_CScriptBase._size) {
              free((pCVar4->scriptSig).super_CScriptBase._union.indirect_contents.indirect);
              uVar3 = aStack_1f0._8_8_;
            }
            aStack_1f0._12_4_ = (undefined4)((ulong)uVar3 >> 0x20);
            aStack_1f0._8_4_ = (undefined4)uVar3;
            *(ulong *)((long)&pCVar5[lVar16].scriptSig.super_CScriptBase._union + 0xc) =
                 CONCAT17(aStack_1f0._M_local_buf[3],
                          CONCAT16(aStack_1f0._M_local_buf[2],
                                   CONCAT24(aStack_1f0._M_allocated_capacity._0_2_,auStack_1f8._4_4_
                                           )));
            *(ulong *)((long)&pCVar5[lVar16].scriptSig.super_CScriptBase._union + 0x14) =
                 CONCAT44(aStack_1f0._8_4_,
                          CONCAT13(aStack_1f0._M_local_buf[7],
                                   CONCAT12(aStack_1f0._M_local_buf[6],
                                            CONCAT11(aStack_1f0._M_local_buf[5],
                                                     aStack_1f0._M_local_buf[4]))));
            (pCVar4->scriptSig).super_CScriptBase._union.indirect_contents.indirect =
                 (char *)local_200;
            *(ulong *)((long)&pCVar5[lVar16].scriptSig.super_CScriptBase._union + 8) =
                 CONCAT44(auStack_1f8._4_4_,auStack_1f8._0_4_);
            pCVar5[lVar16].scriptSig.super_CScriptBase._size = aStack_1f0._12_4_;
            aStack_1f0._12_4_ = 0;
            if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
              operator_delete((void *)local_238._0_8_,(ulong)(local_228._0_8_ + 1));
            }
            if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
              operator_delete((void *)local_d8._0_8_,
                              (ulong)((long)(_func_int ***)local_d8._16_8_ + 1));
            }
            aStack_1f0._M_local_buf[4] = 'e';
            aStack_1f0._M_local_buf[5] = 's';
            aStack_1f0._M_local_buf[6] = 's';
            aStack_1f0._M_allocated_capacity._0_2_ = 0x7573;
            aStack_1f0._M_local_buf[2] = 'c';
            aStack_1f0._M_local_buf[3] = 'c';
            auStack_1f8._0_4_ = 7;
            auStack_1f8._4_4_ = 0;
            aStack_1f0._M_local_buf[7] = '\0';
            local_200 = (undefined1  [8])(auStack_1f8 + 8);
            pUVar12 = ::UniValue::operator[](pUVar14,(string *)local_200);
            local_d8._0_8_ = local_d8 + 0x10;
            local_d8._16_8_ = (sp_counted_base *)0x7373656e746977;
            local_d8._8_8_ = (element_type *)0x7;
            pUVar12 = ::UniValue::operator[](pUVar12,(string *)local_d8);
            ScriptWitnessFromJSON((CScriptWitness *)local_788,pUVar12);
            local_228._0_8_ =
                 *(undefined8 *)
                  ((long)(&(local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start)->prevout + 2) +
                  in_stack_fffffffffffff710 + 0x18);
            pcVar1 = (char *)((long)(&(local_6d8.vin.
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_start)->prevout + 2) +
                             in_stack_fffffffffffff710 + 8);
            local_238._0_8_ = *(undefined8 *)pcVar1;
            local_238._8_8_ = *(undefined8 *)(pcVar1 + 8);
            pcVar1 = (char *)((long)(&(local_6d8.vin.
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_start)->prevout + 2) +
                             in_stack_fffffffffffff710 + 8);
            *(undefined1 (*) [8])pcVar1 = local_788;
            *(pointer *)(pcVar1 + 8) = pvStack_780;
            *(pointer *)
             ((long)(&(local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start)->prevout + 2) +
             in_stack_fffffffffffff710 + 0x18) = local_778;
            local_788 = (undefined1  [8])0x0;
            pvStack_780 = (pointer)0x0;
            local_778 = (pointer)0x0;
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_238);
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_788);
            if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
              operator_delete((void *)local_d8._0_8_,
                              (ulong)((long)(_func_int ***)local_d8._16_8_ + 1));
            }
            if (local_200 != (undefined1  [8])(auStack_1f8 + 8)) {
              operator_delete((void *)local_200,
                              CONCAT17(aStack_1f0._M_local_buf[7],
                                       CONCAT16(aStack_1f0._M_local_buf[6],
                                                CONCAT15(aStack_1f0._M_local_buf[5],
                                                         CONCAT14(aStack_1f0._M_local_buf[4],
                                                                  CONCAT13(aStack_1f0._M_local_buf
                                                                           [3],CONCAT12(aStack_1f0.
                                                                                        _M_local_buf
                                                                                        [2],
                                                  aStack_1f0._M_allocated_capacity._0_2_)))))) + 1);
            }
            CTransaction::CTransaction((CTransaction *)local_d8,&local_6d8);
            memset((PrecomputedTransactionData *)local_200,0,0x102);
            (this_00->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (this_00->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            *(undefined8 *)
             ((long)&(this_00->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                     super__Vector_impl_data._M_finish + 1) = 0;
            *(undefined8 *)
             ((long)&(this_00->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 1) = 0;
            std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_238,&local_6f8);
            PrecomputedTransactionData::Init<CTransaction>
                      ((PrecomputedTransactionData *)local_200,(CTransaction *)local_d8,
                       (vector<CTxOut,_std::allocator<CTxOut>_> *)local_238,false);
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_238);
            puVar21 = DAT_013c6e60;
            local_228._0_8_ = lVar16 << 0x20;
            local_228._8_8_ =
                 local_6f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar16].nValue;
            local_238._0_8_ = &PTR_CheckECDSASignature_013b91a0;
            local_210 = 1;
            local_208 = &local_3a0;
            local_238._8_8_ = (CTransaction *)local_d8;
            local_228._16_8_ = (PrecomputedTransactionData *)local_200;
            for (puVar17 = ALL_CONSENSUS_FLAGS; puVar17 != puVar21; puVar17 = puVar17 + 1) {
              if (((*puVar17 & ~uVar10) == 0 | bVar8) == 1) {
                pBVar19 = (BaseSignatureChecker *)local_238;
                pvVar18 = (iterator)0x0;
                rVar7.super_class_property<bool>.value =
                     (class_property<bool>)
                     VerifyScript((CScript *)
                                  ((long)(&((pointer)local_d8._0_8_)->prevout + 1) +
                                  in_stack_fffffffffffff710 + 4),
                                  &local_6f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar16].scriptPubKey,
                                  (CScriptWitness *)
                                  ((long)(&((pointer)local_d8._0_8_)->prevout + 2) +
                                  in_stack_fffffffffffff710 + 8),*puVar17,pBVar19,(ScriptError *)0x0
                                 );
                local_738 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
                ;
                local_730 = "";
                local_748 = &boost::unit_test::basic_cstring<char_const>::null;
                local_740 = &boost::unit_test::basic_cstring<char_const>::null;
                file_07.m_end = (iterator)0x628;
                file_07.m_begin = (iterator)&local_738;
                msg_06.m_end = pvVar18;
                msg_06.m_begin = (iterator)pBVar19;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                           (size_t)&local_748,msg_06);
                local_760.m_message.px = (element_type *)0x0;
                local_760.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_798 = "ret";
                local_790 = "";
                pvStack_780 = (pointer)((ulong)pvStack_780 & 0xffffffffffffff00);
                local_788 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
                local_778 = (pointer)boost::unit_test::lazy_ostream::inst;
                local_770 = &local_798;
                local_7a8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
                ;
                local_7a0 = "";
                pvVar18 = (iterator)0x1;
                pvVar20 = (iterator)0x0;
                local_760.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)
                         (readonly_property<bool>)rVar7.super_class_property<bool>.value;
                boost::test_tools::tt_detail::report_assertion
                          (&local_760,(lazy_ostream *)local_788,1,0,WARN,(check_type)pUVar14,
                           (size_t)&local_7a8,0x628);
                boost::detail::shared_count::~shared_count(&local_760.m_message.pn);
              }
            }
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(this_00);
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(local_c0);
            std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_d8);
          }
          pp_Var11 = (_func_int **)(auStack_1f8 + 8);
          aStack_1f0._M_local_buf[4] = 'u';
          aStack_1f0._M_local_buf[5] = 'r';
          aStack_1f0._M_local_buf[6] = 'e';
          aStack_1f0._M_allocated_capacity._0_2_ = 0x6166;
          aStack_1f0._M_local_buf[2] = 'i';
          aStack_1f0._M_local_buf[3] = 'l';
          auStack_1f8._0_4_ = 7;
          auStack_1f8._4_4_ = 0;
          aStack_1f0._M_local_buf[7] = '\0';
          pUVar12 = pUVar14;
          local_200 = (undefined1  [8])pp_Var11;
          bVar8 = ::UniValue::findKey(pUVar14,(string *)local_200,(size_t *)local_d8);
          if (local_200 != (undefined1  [8])pp_Var11) {
            operator_delete((void *)local_200,
                            CONCAT17(aStack_1f0._M_local_buf[7],
                                     CONCAT16(aStack_1f0._M_local_buf[6],
                                              CONCAT15(aStack_1f0._M_local_buf[5],
                                                       CONCAT14(aStack_1f0._M_local_buf[4],
                                                                CONCAT13(aStack_1f0._M_local_buf[3],
                                                                         CONCAT12(aStack_1f0.
                                                                                  _M_local_buf[2],
                                                                                  aStack_1f0.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_2_)))))) + 1);
          }
          if (bVar8) {
            local_d8._0_8_ = local_d8 + 0x10;
            local_d8._16_8_ = (sp_counted_base *)0x6572756c696166;
            local_d8._8_8_ = (element_type *)0x7;
            pUVar14 = ::UniValue::operator[](pUVar14,(string *)local_d8);
            local_228._0_8_ = (pointer)0x6953747069726373;
            local_238._8_8_ = (pointer)0x9;
            local_228._8_2_ = 0x67;
            local_238._0_8_ = (pointer)(local_238 + 0x10);
            pUVar14 = ::UniValue::operator[](pUVar14,(string *)local_238);
            psVar13 = ::UniValue::get_str_abi_cxx11_(pUVar14);
            ScriptFromHex((CScript *)local_200,(script_tests *)(psVar13->_M_dataplus)._M_p,
                          (string *)psVar13->_M_string_length);
            pCVar5 = local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start;
            in_stack_fffffffffffff710 = lVar16 * 0x68;
            pCVar4 = local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar16;
            uVar3 = aStack_1f0._8_8_;
            if (0x1c < local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar16].scriptSig.super_CScriptBase._size) {
              free((pCVar4->scriptSig).super_CScriptBase._union.indirect_contents.indirect);
              uVar3 = aStack_1f0._8_8_;
            }
            aStack_1f0._12_4_ = (undefined4)((ulong)uVar3 >> 0x20);
            aStack_1f0._8_4_ = (undefined4)uVar3;
            *(ulong *)((long)&pCVar5[lVar16].scriptSig.super_CScriptBase._union + 0xc) =
                 CONCAT17(aStack_1f0._M_local_buf[3],
                          CONCAT16(aStack_1f0._M_local_buf[2],
                                   CONCAT24(aStack_1f0._M_allocated_capacity._0_2_,auStack_1f8._4_4_
                                           )));
            *(ulong *)((long)&pCVar5[lVar16].scriptSig.super_CScriptBase._union + 0x14) =
                 CONCAT44(aStack_1f0._8_4_,
                          CONCAT13(aStack_1f0._M_local_buf[7],
                                   CONCAT12(aStack_1f0._M_local_buf[6],
                                            CONCAT11(aStack_1f0._M_local_buf[5],
                                                     aStack_1f0._M_local_buf[4]))));
            (pCVar4->scriptSig).super_CScriptBase._union.indirect_contents.indirect =
                 (char *)local_200;
            *(ulong *)((long)&pCVar5[lVar16].scriptSig.super_CScriptBase._union + 8) =
                 CONCAT44(auStack_1f8._4_4_,auStack_1f8._0_4_);
            pCVar5[lVar16].scriptSig.super_CScriptBase._size = aStack_1f0._12_4_;
            aStack_1f0._12_4_ = 0;
            if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
              operator_delete((void *)local_238._0_8_,(ulong)(local_228._0_8_ + 1));
            }
            if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
              operator_delete((void *)local_d8._0_8_,
                              (ulong)((long)(_func_int ***)local_d8._16_8_ + 1));
            }
            aStack_1f0._M_local_buf[4] = 'u';
            aStack_1f0._M_local_buf[5] = 'r';
            aStack_1f0._M_local_buf[6] = 'e';
            aStack_1f0._M_allocated_capacity._0_2_ = 0x6166;
            aStack_1f0._M_local_buf[2] = 'i';
            aStack_1f0._M_local_buf[3] = 'l';
            auStack_1f8._0_4_ = 7;
            auStack_1f8._4_4_ = 0;
            aStack_1f0._M_local_buf[7] = '\0';
            local_200 = (undefined1  [8])pp_Var11;
            pUVar14 = ::UniValue::operator[](pUVar12,(string *)local_200);
            local_d8._0_8_ = local_d8 + 0x10;
            local_d8._16_8_ = (sp_counted_base *)0x7373656e746977;
            local_d8._8_8_ = (element_type *)0x7;
            pUVar14 = ::UniValue::operator[](pUVar14,(string *)local_d8);
            ScriptWitnessFromJSON((CScriptWitness *)local_788,pUVar14);
            local_228._0_8_ =
                 *(undefined8 *)
                  ((long)(&(local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start)->prevout + 2) +
                  in_stack_fffffffffffff710 + 0x18);
            pcVar1 = (char *)((long)(&(local_6d8.vin.
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_start)->prevout + 2) +
                             in_stack_fffffffffffff710 + 8);
            local_238._0_8_ = *(undefined8 *)pcVar1;
            local_238._8_8_ = *(undefined8 *)(pcVar1 + 8);
            pcVar1 = (char *)((long)(&(local_6d8.vin.
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_start)->prevout + 2) +
                             in_stack_fffffffffffff710 + 8);
            *(undefined1 (*) [8])pcVar1 = local_788;
            *(pointer *)(pcVar1 + 8) = pvStack_780;
            *(pointer *)
             ((long)(&(local_6d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start)->prevout + 2) +
             in_stack_fffffffffffff710 + 0x18) = local_778;
            local_788 = (undefined1  [8])0x0;
            pvStack_780 = (pointer)0x0;
            local_778 = (pointer)0x0;
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_238);
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_788);
            if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
              operator_delete((void *)local_d8._0_8_,
                              (ulong)((long)(_func_int ***)local_d8._16_8_ + 1));
            }
            if (local_200 != (undefined1  [8])pp_Var11) {
              operator_delete((void *)local_200,
                              CONCAT17(aStack_1f0._M_local_buf[7],
                                       CONCAT16(aStack_1f0._M_local_buf[6],
                                                CONCAT15(aStack_1f0._M_local_buf[5],
                                                         CONCAT14(aStack_1f0._M_local_buf[4],
                                                                  CONCAT13(aStack_1f0._M_local_buf
                                                                           [3],CONCAT12(aStack_1f0.
                                                                                        _M_local_buf
                                                                                        [2],
                                                  aStack_1f0._M_allocated_capacity._0_2_)))))) + 1);
            }
            CTransaction::CTransaction((CTransaction *)local_d8,&local_6d8);
            memset((PrecomputedTransactionData *)local_200,0,0x102);
            (this_00->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (this_00->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            *(undefined8 *)
             ((long)&(this_00->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                     super__Vector_impl_data._M_finish + 1) = 0;
            *(undefined8 *)
             ((long)&(this_00->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 1) = 0;
            std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_238,&local_6f8);
            PrecomputedTransactionData::Init<CTransaction>
                      ((PrecomputedTransactionData *)local_200,(CTransaction *)local_d8,
                       (vector<CTxOut,_std::allocator<CTxOut>_> *)local_238,false);
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_238);
            puVar17 = DAT_013c6e60;
            local_228._0_8_ = lVar16 << 0x20;
            local_228._8_8_ =
                 local_6f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar16].nValue;
            local_238._0_8_ = &PTR_CheckECDSASignature_013b91a0;
            local_210 = 1;
            local_208 = &local_3a0;
            local_238._8_8_ = (CTransaction *)local_d8;
            local_228._16_8_ = (PrecomputedTransactionData *)local_200;
            for (puVar21 = ALL_CONSENSUS_FLAGS; puVar21 != puVar17; puVar21 = puVar21 + 1) {
              if ((uVar10 & ~*puVar21) == 0) {
                pBVar19 = (BaseSignatureChecker *)local_238;
                pvVar18 = (iterator)0x0;
                bVar8 = VerifyScript((CScript *)
                                     ((long)((COutPoint *)local_d8._0_8_ + 1) +
                                     in_stack_fffffffffffff710 + 4),
                                     &local_6f8.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar16].scriptPubKey,
                                     (CScriptWitness *)
                                     ((long)((COutPoint *)local_d8._0_8_ + 2) +
                                     in_stack_fffffffffffff710 + 8),*puVar21,pBVar19,
                                     (ScriptError *)0x0);
                local_798 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
                ;
                local_790 = "";
                local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
                local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
                file_08.m_end = (iterator)0x639;
                file_08.m_begin = (iterator)&local_798;
                msg_07.m_end = pvVar18;
                msg_07.m_begin = (iterator)pBVar19;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                           (size_t)&local_7b8,msg_07);
                local_760.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)!bVar8;
                local_760.m_message.px = (element_type *)0x0;
                local_760.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_7c8 = "!ret";
                local_7c0 = "";
                pvStack_780 = (pointer)((ulong)pvStack_780 & 0xffffffffffffff00);
                local_788 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
                local_778 = (pointer)boost::unit_test::lazy_ostream::inst;
                local_770 = &local_7c8;
                local_7d8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
                ;
                local_7d0 = "";
                pvVar18 = (iterator)0x1;
                pvVar20 = (iterator)0x0;
                boost::test_tools::tt_detail::report_assertion
                          (&local_760,(lazy_ostream *)local_788,1,0,WARN,(check_type)pUVar12,
                           (size_t)&local_7d8,0x639);
                boost::detail::shared_count::~shared_count(&local_760.m_message.pn);
              }
            }
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(this_00);
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(local_c0);
            std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_d8);
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_6f8);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_6d8.vout);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_6d8.vin);
          index = index + 1;
        } while (index < (ulong)(((long)local_670.values.
                                        super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_670.values.
                                        super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3) *
                                0x2e8ba2e8ba2e8ba3));
      }
      std::ifstream::close();
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_670.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_670.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670.val._M_dataplus._M_p != &local_670.val.field_2) {
        operator_delete(local_670.val._M_dataplus._M_p,
                        local_670.val.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._M_dataplus._M_p != &local_618.field_2) {
        operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
      }
      std::ifstream::~ifstream(&local_5f8);
    }
    std::filesystem::__cxx11::path::~path(&local_3c8);
  }
  if (local_3a0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_3a0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>.
                    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_3a0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_3a0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_3a0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3a0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_3a0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3a0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_3a0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  if ((__uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
       )local_3a0.setValid.collection_flags.mem._M_t.
        super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
        .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
       )0x0) {
    operator_delete__((void *)local_3a0.setValid.collection_flags.mem._M_t.
                              super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                              .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>.
                              _M_head_impl);
  }
  local_3a0.setValid.collection_flags.mem._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl =
       (unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
       )(__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
         )0x0;
  if (local_3a0.setValid.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a0.setValid.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3a0.setValid.table.
                          super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a0.setValid.table.
                          super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_assets_test)
{
    // See src/test/fuzz/script_assets_test_minimizer.cpp for information on how to generate
    // the script_assets_test.json file used by this test.
    SignatureCache signature_cache{DEFAULT_SIGNATURE_CACHE_BYTES};

    const char* dir = std::getenv("DIR_UNIT_TEST_DATA");
    BOOST_WARN_MESSAGE(dir != nullptr, "Variable DIR_UNIT_TEST_DATA unset, skipping script_assets_test");
    if (dir == nullptr) return;
    auto path = fs::path(dir) / "script_assets_test.json";
    bool exists = fs::exists(path);
    BOOST_WARN_MESSAGE(exists, "File $DIR_UNIT_TEST_DATA/script_assets_test.json not found, skipping script_assets_test");
    if (!exists) return;
    std::ifstream file{path};
    BOOST_CHECK(file.is_open());
    file.seekg(0, std::ios::end);
    size_t length = file.tellg();
    file.seekg(0, std::ios::beg);
    std::string data(length, '\0');
    file.read(data.data(), data.size());
    UniValue tests = read_json(data);
    BOOST_CHECK(tests.isArray());
    BOOST_CHECK(tests.size() > 0);

    for (size_t i = 0; i < tests.size(); i++) {
        AssetTest(tests[i], signature_cache);
    }
    file.close();
}